

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ShowMetricsWindow::Funcs::NodeDrawList
               (ImGuiWindow *window,ImDrawList *draw_list,char *label)

{
  ImDrawVert *pIVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  ImDrawVert *pIVar4;
  ImGuiContext *pIVar5;
  undefined8 uVar6;
  ImDrawList *this;
  bool bVar7;
  bool bVar8;
  char cVar9;
  int iVar10;
  uint uVar11;
  ImDrawCmd *pIVar12;
  char *pcVar13;
  long lVar14;
  char *pcVar15;
  ImDrawCmd *pIVar16;
  unsigned_short *puVar17;
  int iVar18;
  ImGuiContext *g;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  ImGuiListClipper clipper;
  ImVec2 triangles_pos [3];
  char buf [300];
  int iVar23;
  int local_1dc;
  undefined1 local_1d8 [12];
  float fStack_1cc;
  uint uStack_1c8;
  uint local_1c4;
  long local_1c0;
  ImDrawCmd *local_1b8;
  ImDrawList *local_1b0;
  uint local_1a4;
  ImGuiContext *local_1a0;
  ulong local_198;
  ImVec2 local_190;
  ImVec2 local_188 [4];
  undefined1 local_168 [12];
  float fStack_15c;
  undefined1 local_3c [12];
  
  pcVar13 = "";
  if (draw_list->_OwnerName != (char *)0x0) {
    pcVar13 = draw_list->_OwnerName;
  }
  iVar23 = (draw_list->CmdBuffer).Size;
  bVar7 = TreeNode(draw_list,"%s: \'%s\' %d vtx, %d indices, %d cmds","DrawList",pcVar13,
                   (ulong)(uint)(draw_list->VtxBuffer).Size,(ulong)(uint)(draw_list->IdxBuffer).Size
                   ,iVar23);
  pIVar5 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  pIVar3->WriteAccessed = true;
  if (pIVar3->DrawList == draw_list) {
    pIVar3->WriteAccessed = true;
    if (pIVar3->SkipItems == false) {
      (pIVar3->DC).CursorPos.x = (pIVar5->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x;
      (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
      (pIVar3->DC).CurrentLineSize = (pIVar3->DC).PrevLineSize;
      (pIVar3->DC).CurrentLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
    }
    local_168._0_4_ = 1.0;
    local_168._4_4_ = 0.3921569;
    local_168._8_4_ = 0.3921569;
    fStack_15c = 1.0;
    TextColored((ImVec4 *)local_168,"CURRENTLY APPENDING");
    if (!bVar7) {
      return;
    }
  }
  else {
    local_1b0 = &pIVar5->OverlayDrawList;
    if ((window != (ImGuiWindow *)0x0) && (bVar8 = IsItemHovered(0), bVar8)) {
      local_168._4_4_ = (window->Size).y + (window->Pos).y;
      local_168._0_4_ = (window->Size).x + (window->Pos).x;
      ImDrawList::AddRect(local_1b0,&window->Pos,(ImVec2 *)local_168,0xff00ffff,0.0,0xf,1.0);
    }
    if (!bVar7) {
      return;
    }
    if (0 < (draw_list->CmdBuffer).Size) {
      pIVar12 = (draw_list->CmdBuffer).Data;
      local_1dc = 0;
      local_1a0 = pIVar5;
      pIVar16 = pIVar12;
      do {
        if (pIVar16->UserCallback == (ImDrawCallback)0x0) {
          if (pIVar16->ElemCount != 0) {
            if ((draw_list->IdxBuffer).Size < 1) {
              pcVar13 = "non-indexed";
              puVar17 = (unsigned_short *)0x0;
            }
            else {
              puVar17 = (draw_list->IdxBuffer).Data;
              pcVar13 = "indexed";
            }
            local_1b8 = pIVar16;
            cVar9 = TreeNode((void *)(((long)pIVar16 - (long)pIVar12 >> 4) * -0x5555555555555555),
                             "Draw %4d %s vtx, tex 0x%p, clip_rect (%4.0f,%4.0f)-(%4.0f,%4.0f)",
                             SUB84((double)(pIVar16->ClipRect).x,0),
                             SUB84((double)(pIVar16->ClipRect).y,0),(double)(pIVar16->ClipRect).z,
                             (double)(pIVar16->ClipRect).w,(ulong)pIVar16->ElemCount,pcVar13,
                             pIVar16->TextureId,pIVar16,iVar23);
            if (show_draw_cmd_clip_rects == true) {
              local_1c0 = CONCAT71(local_1c0._1_7_,cVar9);
              bVar7 = IsItemHovered(0);
              this = local_1b0;
              cVar9 = (char)local_1c0;
              if (bVar7) {
                local_1d8._0_4_ = 3.4028235e+38;
                local_1d8._4_4_ = 3.4028235e+38;
                uVar6 = local_1d8._0_8_;
                local_1d8._8_4_ = -3.4028235e+38;
                fStack_1cc = -3.4028235e+38;
                if (0 < (int)local_1b8->ElemCount) {
                  local_1d8._0_4_ = 3.4028235e+38;
                  local_1d8._4_4_ = 3.4028235e+38;
                  pIVar4 = (draw_list->VtxBuffer).Data;
                  lVar14 = (long)local_1dc;
                  fVar19 = fStack_1cc;
                  fVar22 = (float)local_1d8._4_4_;
                  fVar20 = (float)local_1d8._8_4_;
                  fVar21 = (float)local_1d8._0_4_;
                  local_1d8._0_8_ = uVar6;
                  do {
                    uVar11 = (uint)lVar14;
                    if (puVar17 != (unsigned_short *)0x0) {
                      uVar11 = (uint)puVar17[lVar14];
                    }
                    fVar2 = pIVar4[(int)uVar11].pos.x;
                    if (fVar2 < fVar21) {
                      local_1d8._0_4_ = fVar2;
                      fVar21 = fVar2;
                    }
                    pIVar1 = pIVar4 + (int)uVar11;
                    fVar2 = (pIVar1->pos).y;
                    if (fVar2 < fVar22) {
                      local_1d8._4_4_ = fVar2;
                      fVar22 = fVar2;
                    }
                    fVar2 = (pIVar1->pos).x;
                    if (fVar20 < fVar2) {
                      fVar20 = fVar2;
                      local_1d8._8_4_ = fVar2;
                    }
                    fVar2 = (pIVar1->pos).y;
                    if (fVar19 < fVar2) {
                      fVar19 = fVar2;
                      fStack_1cc = fVar2;
                    }
                    lVar14 = lVar14 + 1;
                  } while (lVar14 < (int)(local_1b8->ElemCount + local_1dc));
                }
                local_168._8_4_ = (undefined4)(int)(local_1b8->ClipRect).z;
                fStack_15c = (float)(int)(local_1b8->ClipRect).w;
                local_168._4_4_ = (float)(int)(local_1b8->ClipRect).y;
                local_168._0_4_ = (float)(int)(local_1b8->ClipRect).x;
                ImDrawList::AddRect(local_1b0,(ImVec2 *)local_168,(ImVec2 *)(local_168 + 8),
                                    0xff00ffff,0.0,0xf,1.0);
                local_1d8._8_4_ = (undefined4)(int)(float)local_1d8._8_4_;
                fStack_1cc = (float)(int)fStack_1cc;
                local_1d8._4_4_ = (float)(int)(float)local_1d8._4_4_;
                local_1d8._0_4_ = (float)(int)(float)local_1d8._0_4_;
                ImDrawList::AddRect(this,(ImVec2 *)local_1d8,(ImVec2 *)(local_1d8 + 8),0xffff00ff,
                                    0.0,0xf,1.0);
                cVar9 = (char)local_1c0;
              }
            }
            pIVar16 = local_1b8;
            if (cVar9 != '\0') {
              pIVar3 = GImGui->CurrentWindow;
              local_1d8._4_4_ = -1.0;
              local_1d8._0_4_ = ((pIVar3->DC).CursorPos.y - (pIVar3->Pos).y) + (pIVar3->Scroll).y;
              local_1d8._8_4_ = local_1b8->ElemCount / 3;
              fStack_1cc = 0.0;
              uStack_1c8 = 0xffffffff;
              local_1c4 = 0xffffffff;
              while (bVar7 = ImGuiListClipper::Step((ImGuiListClipper *)local_1d8), bVar7) {
                local_1a4 = local_1c4;
                if ((int)uStack_1c8 < (int)local_1c4) {
                  iVar18 = uStack_1c8 * 3 + local_1dc;
                  uVar11 = uStack_1c8;
                  do {
                    pcVar13 = local_168;
                    local_198 = (ulong)uVar11;
                    local_188[0].x = 0.0;
                    local_188[0].y = 0.0;
                    local_188[1].x = 0.0;
                    local_188[1].y = 0.0;
                    local_188[2].x = 0.0;
                    local_188[2].y = 0.0;
                    lVar14 = 0;
                    local_1c0 = (long)iVar18;
                    do {
                      if (puVar17 == (unsigned_short *)0x0) {
                        uVar11 = (int)local_1c0 + (int)lVar14;
                      }
                      else {
                        uVar11 = (uint)puVar17[iVar18 + lVar14];
                      }
                      pIVar4 = (draw_list->VtxBuffer).Data;
                      local_188[lVar14] = pIVar4[(int)uVar11].pos;
                      pcVar15 = "   ";
                      if (lVar14 == 0) {
                        pcVar15 = "vtx";
                      }
                      iVar10 = ImFormatString(pcVar13,(long)((int)local_3c - (int)pcVar13),
                                              "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n"
                                              ,SUB84((double)pIVar4[(int)uVar11].pos.x,0),
                                              SUB84((double)pIVar4[(int)uVar11].pos.y,0),
                                              (double)pIVar4[(int)uVar11].uv.x,
                                              (double)pIVar4[(int)uVar11].uv.y,pcVar15,
                                              (ulong)(uint)(iVar18 + (int)lVar14),
                                              (ulong)pIVar4[(int)uVar11].col);
                      pcVar13 = pcVar13 + iVar10;
                      lVar14 = lVar14 + 1;
                    } while (lVar14 != 3);
                    local_190.x = 0.0;
                    local_190.y = 0.0;
                    Selectable(local_168,false,0,&local_190);
                    bVar7 = IsItemHovered(0);
                    pIVar5 = local_1a0;
                    if (bVar7) {
                      uVar11 = (local_1a0->OverlayDrawList).Flags;
                      (local_1a0->OverlayDrawList).Flags = uVar11 & 0xfffffffe;
                      ImDrawList::AddPolyline(local_1b0,local_188,3,0xff00ffff,true,1.0);
                      (pIVar5->OverlayDrawList).Flags = uVar11;
                    }
                    iVar18 = iVar18 + 3;
                    uVar11 = (int)local_198 + 1;
                  } while (uVar11 != local_1a4);
                }
              }
              TreePop();
              pIVar16 = local_1b8;
            }
          }
        }
        else {
          BulletText("Callback %p, user_data %p",pIVar16->UserCallback,pIVar16->UserCallbackData);
        }
        local_1dc = local_1dc + pIVar16->ElemCount;
        pIVar16 = pIVar16 + 1;
        pIVar12 = (draw_list->CmdBuffer).Data;
      } while (pIVar16 < pIVar12 + (draw_list->CmdBuffer).Size);
    }
  }
  TreePop();
  return;
}

Assistant:

static void NodeDrawList(ImGuiWindow* window, ImDrawList* draw_list, const char* label)
        {
            bool node_open = ImGui::TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, draw_list->CmdBuffer.Size);
            if (draw_list == ImGui::GetWindowDrawList())
            {
                ImGui::SameLine();
                ImGui::TextColored(ImColor(255,100,100), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
                if (node_open) ImGui::TreePop();
                return;
            }

            ImDrawList* overlay_draw_list = GetOverlayDrawList(window); // Render additional visuals into the top-most draw list
            if (window && IsItemHovered())
                overlay_draw_list->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
            if (!node_open)
                return;

            int elem_offset = 0;
            for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.begin(); pcmd < draw_list->CmdBuffer.end(); elem_offset += pcmd->ElemCount, pcmd++)
            {
                if (pcmd->UserCallback == NULL && pcmd->ElemCount == 0)
                    continue;
                if (pcmd->UserCallback)
                {
                    ImGui::BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
                    continue;
                }
                ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
                bool pcmd_node_open = ImGui::TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "Draw %4d %s vtx, tex 0x%p, clip_rect (%4.0f,%4.0f)-(%4.0f,%4.0f)", pcmd->ElemCount, draw_list->IdxBuffer.Size > 0 ? "indexed" : "non-indexed", pcmd->TextureId, pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
                if (show_draw_cmd_clip_rects && ImGui::IsItemHovered())
                {
                    ImRect clip_rect = pcmd->ClipRect;
                    ImRect vtxs_rect;
                    for (int i = elem_offset; i < elem_offset + (int)pcmd->ElemCount; i++)
                        vtxs_rect.Add(draw_list->VtxBuffer[idx_buffer ? idx_buffer[i] : i].pos);
                    clip_rect.Floor(); overlay_draw_list->AddRect(clip_rect.Min, clip_rect.Max, IM_COL32(255,255,0,255));
                    vtxs_rect.Floor(); overlay_draw_list->AddRect(vtxs_rect.Min, vtxs_rect.Max, IM_COL32(255,0,255,255));
                }
                if (!pcmd_node_open)
                    continue;

                // Display individual triangles/vertices. Hover on to get the corresponding triangle highlighted.
                ImGuiListClipper clipper(pcmd->ElemCount/3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
                while (clipper.Step())
                    for (int prim = clipper.DisplayStart, vtx_i = elem_offset + clipper.DisplayStart*3; prim < clipper.DisplayEnd; prim++)
                    {
                        char buf[300];
                        char *buf_p = buf, *buf_end = buf + IM_ARRAYSIZE(buf);
                        ImVec2 triangles_pos[3];
                        for (int n = 0; n < 3; n++, vtx_i++)
                        {
                            ImDrawVert& v = draw_list->VtxBuffer[idx_buffer ? idx_buffer[vtx_i] : vtx_i];
                            triangles_pos[n] = v.pos;
                            buf_p += ImFormatString(buf_p, (int)(buf_end - buf_p), "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n", (n == 0) ? "vtx" : "   ", vtx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                        }
                        ImGui::Selectable(buf, false);
                        if (ImGui::IsItemHovered())
                        {
                            ImDrawListFlags backup_flags = overlay_draw_list->Flags;
                            overlay_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines at is more readable for very large and thin triangles.
                            overlay_draw_list->AddPolyline(triangles_pos, 3, IM_COL32(255,255,0,255), true, 1.0f);
                            overlay_draw_list->Flags = backup_flags;
                        }
                    }
                ImGui::TreePop();
            }
            ImGui::TreePop();
        }